

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMvMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  int iVar1;
  undefined4 uVar2;
  Scene *pSVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int iVar18;
  int iVar19;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar20;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar21;
  byte bVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  ulong uVar30;
  uint uVar31;
  AABBNodeMB4D *node1;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar44;
  StackItemT<embree::NodeRefPtr<4>_> SVar45;
  StackItemT<embree::NodeRefPtr<4>_> SVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [64];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined4 uVar83;
  float fVar84;
  float fVar86;
  float fVar87;
  undefined1 auVar85 [16];
  float fVar88;
  float fVar89;
  float fVar92;
  float fVar93;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [64];
  long local_11f8;
  undefined1 local_11c8 [16];
  long local_11b8;
  ulong local_11b0;
  RTCFilterFunctionNArguments args;
  vfloat<4> tNear;
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  undefined1 local_1078 [16];
  float local_1068 [4];
  undefined1 local_1058 [16];
  undefined1 local_1048 [16];
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  RTCHitN local_1008 [16];
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  undefined4 local_fc8;
  undefined4 uStack_fc4;
  undefined4 uStack_fc0;
  undefined4 uStack_fbc;
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  uint local_f98;
  uint uStack_f94;
  uint uStack_f90;
  uint uStack_f8c;
  uint uStack_f88;
  uint uStack_f84;
  uint uStack_f80;
  uint uStack_f7c;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  ulong uVar26;
  
  pSVar21 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  auVar35 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar36 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar37 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  fVar88 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar94 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar98 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar38 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar88 * 0.99999964)));
  auVar39 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar94 * 0.99999964)));
  auVar40 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar98 * 0.99999964)));
  fVar88 = fVar88 * 1.0000004;
  fVar94 = fVar94 * 1.0000004;
  fVar98 = fVar98 * 1.0000004;
  uVar30 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_11b0 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar34 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar27 = local_11b0 ^ 0x10;
  iVar1 = (tray->tnear).field_0.i[k];
  local_1048._4_4_ = iVar1;
  local_1048._0_4_ = iVar1;
  local_1048._8_4_ = iVar1;
  local_1048._12_4_ = iVar1;
  auVar102 = ZEXT1664(local_1048);
  iVar1 = (tray->tfar).field_0.i[k];
  auVar74 = ZEXT1664(CONCAT412(iVar1,CONCAT48(iVar1,CONCAT44(iVar1,iVar1))));
  local_1058 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_1018 = fVar88;
  fStack_1014 = fVar88;
  fStack_1010 = fVar88;
  fStack_100c = fVar88;
  local_1028 = fVar94;
  fStack_1024 = fVar94;
  fStack_1020 = fVar94;
  fStack_101c = fVar94;
  local_1038 = fVar98;
  fStack_1034 = fVar98;
  fStack_1030 = fVar98;
  fStack_102c = fVar98;
  fVar97 = fVar98;
  fVar96 = fVar98;
  fVar95 = fVar98;
  fVar93 = fVar94;
  fVar92 = fVar94;
  fVar89 = fVar94;
  fVar87 = fVar88;
  fVar86 = fVar88;
  fVar84 = fVar88;
LAB_006c9db0:
  do {
    pSVar20 = pSVar21 + -1;
    pSVar21 = pSVar21 + -1;
    if ((float)pSVar20->dist <= *(float *)(ray + k * 4 + 0x80)) {
      uVar33 = (pSVar21->ptr).ptr;
      while ((uVar33 & 8) == 0) {
        uVar32 = uVar33 & 0xfffffffffffffff0;
        uVar83 = *(undefined4 *)(ray + k * 4 + 0x70);
        auVar62._4_4_ = uVar83;
        auVar62._0_4_ = uVar83;
        auVar62._8_4_ = uVar83;
        auVar62._12_4_ = uVar83;
        auVar41 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar32 + 0x80 + uVar30),auVar62,
                                  *(undefined1 (*) [16])(uVar32 + 0x20 + uVar30));
        auVar41 = vsubps_avx512vl(auVar41,auVar35);
        auVar41 = vmulps_avx512vl(auVar38,auVar41);
        auVar41 = vmaxps_avx(auVar102._0_16_,auVar41);
        auVar42 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar32 + 0x80 + local_11b0),auVar62,
                                  *(undefined1 (*) [16])(uVar32 + 0x20 + local_11b0));
        auVar42 = vsubps_avx512vl(auVar42,auVar36);
        auVar43 = vmulps_avx512vl(auVar39,auVar42);
        auVar42 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar32 + 0x80 + uVar34),auVar62,
                                  *(undefined1 (*) [16])(uVar32 + 0x20 + uVar34));
        auVar42 = vsubps_avx512vl(auVar42,auVar37);
        auVar42 = vmulps_avx512vl(auVar40,auVar42);
        auVar42 = vmaxps_avx(auVar43,auVar42);
        tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vmaxps_avx(auVar41,auVar42);
        auVar41 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar32 + 0x80 + (uVar30 ^ 0x10)),auVar62,
                                  *(undefined1 (*) [16])(uVar32 + 0x20 + (uVar30 ^ 0x10)));
        auVar41 = vsubps_avx512vl(auVar41,auVar35);
        auVar42._0_4_ = fVar84 * auVar41._0_4_;
        auVar42._4_4_ = fVar86 * auVar41._4_4_;
        auVar42._8_4_ = fVar87 * auVar41._8_4_;
        auVar42._12_4_ = fVar88 * auVar41._12_4_;
        auVar41 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar32 + 0x80 + uVar27),auVar62,
                                  *(undefined1 (*) [16])(uVar32 + 0x20 + uVar27));
        auVar41 = vsubps_avx512vl(auVar41,auVar36);
        auVar43._0_4_ = fVar89 * auVar41._0_4_;
        auVar43._4_4_ = fVar92 * auVar41._4_4_;
        auVar43._8_4_ = fVar93 * auVar41._8_4_;
        auVar43._12_4_ = fVar94 * auVar41._12_4_;
        auVar41 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar32 + 0x80 + (uVar34 ^ 0x10)),auVar62,
                                  *(undefined1 (*) [16])(uVar32 + 0x20 + (uVar34 ^ 0x10)));
        auVar41 = vsubps_avx512vl(auVar41,auVar37);
        auVar52._0_4_ = fVar95 * auVar41._0_4_;
        auVar52._4_4_ = fVar96 * auVar41._4_4_;
        auVar52._8_4_ = fVar97 * auVar41._8_4_;
        auVar52._12_4_ = fVar98 * auVar41._12_4_;
        auVar41 = vminps_avx(auVar43,auVar52);
        auVar42 = vminps_avx(auVar74._0_16_,auVar42);
        auVar41 = vminps_avx(auVar42,auVar41);
        uVar12 = vcmpps_avx512vl((undefined1  [16])tNear.field_0,auVar41,2);
        uVar23 = (uint)uVar12;
        if (((uint)uVar33 & 7) == 6) {
          uVar14 = vcmpps_avx512vl(auVar62,*(undefined1 (*) [16])(uVar32 + 0xf0),1);
          uVar13 = vcmpps_avx512vl(auVar62,*(undefined1 (*) [16])(uVar32 + 0xe0),0xd);
          uVar23 = (uint)(byte)((byte)uVar14 & (byte)uVar13 & (byte)uVar12);
        }
        if ((byte)uVar23 == 0) {
          if (pSVar21 == stack) {
            return;
          }
          goto LAB_006c9db0;
        }
        lVar29 = 0;
        for (uVar33 = (ulong)(byte)uVar23; (uVar33 & 1) == 0;
            uVar33 = uVar33 >> 1 | 0x8000000000000000) {
          lVar29 = lVar29 + 1;
        }
        uVar33 = *(ulong *)(uVar32 + lVar29 * 8);
        uVar23 = (uVar23 & 0xff) - 1 & uVar23 & 0xff;
        uVar26 = (ulong)uVar23;
        if (uVar23 != 0) {
          uVar25 = tNear.field_0.i[lVar29];
          lVar29 = 0;
          for (; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
            lVar29 = lVar29 + 1;
          }
          uVar23 = uVar23 - 1 & uVar23;
          uVar28 = (ulong)uVar23;
          uVar26 = *(ulong *)(uVar32 + lVar29 * 8);
          uVar24 = tNear.field_0.i[lVar29];
          if (uVar23 == 0) {
            if (uVar25 < uVar24) {
              (pSVar21->ptr).ptr = uVar26;
              pSVar21->dist = uVar24;
              pSVar21 = pSVar21 + 1;
            }
            else {
              (pSVar21->ptr).ptr = uVar33;
              pSVar21->dist = uVar25;
              pSVar21 = pSVar21 + 1;
              uVar33 = uVar26;
            }
          }
          else {
            auVar41._8_8_ = 0;
            auVar41._0_8_ = uVar33;
            auVar41 = vpunpcklqdq_avx(auVar41,ZEXT416(uVar25));
            auVar53._8_8_ = 0;
            auVar53._0_8_ = uVar26;
            auVar42 = vpunpcklqdq_avx(auVar53,ZEXT416(uVar24));
            lVar29 = 0;
            for (; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
              lVar29 = lVar29 + 1;
            }
            uVar23 = uVar23 - 1 & uVar23;
            uVar33 = (ulong)uVar23;
            auVar54._8_8_ = 0;
            auVar54._0_8_ = *(ulong *)(uVar32 + lVar29 * 8);
            auVar53 = vpunpcklqdq_avx(auVar54,ZEXT416((uint)tNear.field_0.i[lVar29]));
            auVar43 = vpshufd_avx(auVar41,0xaa);
            auVar62 = vpshufd_avx(auVar42,0xaa);
            auVar52 = vpshufd_avx(auVar53,0xaa);
            if (uVar23 == 0) {
              uVar33 = vpcmpgtd_avx512vl(auVar62,auVar43);
              uVar33 = uVar33 & 0xf;
              auVar62 = vpblendmd_avx512vl(auVar42,auVar41);
              bVar6 = (bool)((byte)uVar33 & 1);
              auVar58._0_4_ = (uint)bVar6 * auVar62._0_4_ | (uint)!bVar6 * auVar43._0_4_;
              bVar6 = (bool)((byte)(uVar33 >> 1) & 1);
              auVar58._4_4_ = (uint)bVar6 * auVar62._4_4_ | (uint)!bVar6 * auVar43._4_4_;
              bVar6 = (bool)((byte)(uVar33 >> 2) & 1);
              auVar58._8_4_ = (uint)bVar6 * auVar62._8_4_ | (uint)!bVar6 * auVar43._8_4_;
              bVar6 = SUB81(uVar33 >> 3,0);
              auVar58._12_4_ = (uint)bVar6 * auVar62._12_4_ | (uint)!bVar6 * auVar43._12_4_;
              auVar42 = vmovdqa32_avx512vl(auVar42);
              bVar6 = (bool)((byte)uVar33 & 1);
              auVar59._0_4_ = (uint)bVar6 * auVar42._0_4_ | (uint)!bVar6 * auVar41._0_4_;
              bVar6 = (bool)((byte)(uVar33 >> 1) & 1);
              auVar59._4_4_ = (uint)bVar6 * auVar42._4_4_ | (uint)!bVar6 * auVar41._4_4_;
              bVar6 = (bool)((byte)(uVar33 >> 2) & 1);
              auVar59._8_4_ = (uint)bVar6 * auVar42._8_4_ | (uint)!bVar6 * auVar41._8_4_;
              bVar6 = SUB81(uVar33 >> 3,0);
              auVar59._12_4_ = (uint)bVar6 * auVar42._12_4_ | (uint)!bVar6 * auVar41._12_4_;
              auVar41 = vpshufd_avx(auVar58,0xaa);
              uVar32 = vpcmpgtd_avx512vl(auVar52,auVar41);
              uVar32 = uVar32 & 0xf;
              auVar42 = vpblendmd_avx512vl(auVar53,auVar58);
              bVar6 = (bool)((byte)uVar32 & 1);
              bVar8 = (bool)((byte)(uVar32 >> 1) & 1);
              uVar33 = CONCAT44((uint)bVar8 * auVar42._4_4_ | (uint)!bVar8 * auVar41._4_4_,
                                (uint)bVar6 * auVar42._0_4_ | (uint)!bVar6 * auVar41._0_4_);
              auVar41 = vmovdqa32_avx512vl(auVar53);
              bVar6 = (bool)((byte)uVar32 & 1);
              auVar60._0_4_ = (uint)bVar6 * auVar41._0_4_ | !bVar6 * auVar58._0_4_;
              bVar6 = (bool)((byte)(uVar32 >> 1) & 1);
              auVar60._4_4_ = (uint)bVar6 * auVar41._4_4_ | !bVar6 * auVar58._4_4_;
              bVar6 = (bool)((byte)(uVar32 >> 2) & 1);
              auVar60._8_4_ = (uint)bVar6 * auVar41._8_4_ | !bVar6 * auVar58._8_4_;
              bVar6 = SUB81(uVar32 >> 3,0);
              auVar60._12_4_ = (uint)bVar6 * auVar41._12_4_ | !bVar6 * auVar58._12_4_;
              auVar41 = vpshufd_avx(auVar60,0xaa);
              auVar42 = vpshufd_avx(auVar59,0xaa);
              uVar32 = vpcmpgtd_avx512vl(auVar41,auVar42);
              uVar32 = uVar32 & 0xf;
              auVar42 = vpblendmd_avx512vl(auVar60,auVar59);
              bVar6 = (bool)((byte)uVar32 & 1);
              SVar44.ptr.ptr._0_4_ = (uint)bVar6 * auVar42._0_4_ | (uint)!bVar6 * auVar41._0_4_;
              bVar6 = (bool)((byte)(uVar32 >> 1) & 1);
              SVar44.ptr.ptr._4_4_ = (uint)bVar6 * auVar42._4_4_ | (uint)!bVar6 * auVar41._4_4_;
              bVar6 = (bool)((byte)(uVar32 >> 2) & 1);
              SVar44.dist = (uint)bVar6 * auVar42._8_4_ | (uint)!bVar6 * auVar41._8_4_;
              bVar6 = SUB81(uVar32 >> 3,0);
              SVar44._12_4_ = (uint)bVar6 * auVar42._12_4_ | (uint)!bVar6 * auVar41._12_4_;
              auVar41 = vmovdqa32_avx512vl(auVar60);
              bVar6 = (bool)((byte)uVar32 & 1);
              bVar8 = (bool)((byte)(uVar32 >> 1) & 1);
              bVar11 = (bool)((byte)(uVar32 >> 2) & 1);
              bVar9 = SUB81(uVar32 >> 3,0);
              *(uint *)&(pSVar21->ptr).ptr = (uint)bVar6 * auVar41._0_4_ | !bVar6 * auVar59._0_4_;
              *(uint *)((long)&(pSVar21->ptr).ptr + 4) =
                   (uint)bVar8 * auVar41._4_4_ | !bVar8 * auVar59._4_4_;
              pSVar21->dist = (uint)bVar11 * auVar41._8_4_ | !bVar11 * auVar59._8_4_;
              *(uint *)&pSVar21->field_0xc = (uint)bVar9 * auVar41._12_4_ | !bVar9 * auVar59._12_4_;
              pSVar21[1] = SVar44;
              pSVar21 = pSVar21 + 2;
            }
            else {
              lVar29 = 0;
              for (; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000) {
                lVar29 = lVar29 + 1;
              }
              uVar23 = tNear.field_0.i[lVar29];
              auVar57._8_8_ = 0;
              auVar57._0_8_ = *(ulong *)(uVar32 + lVar29 * 8);
              auVar54 = vpunpcklqdq_avx(auVar57,ZEXT416(uVar23));
              uVar33 = vpcmpgtd_avx512vl(auVar62,auVar43);
              uVar33 = uVar33 & 0xf;
              auVar62 = vpblendmd_avx512vl(auVar42,auVar41);
              bVar6 = (bool)((byte)uVar33 & 1);
              auVar55._0_4_ = (uint)bVar6 * auVar62._0_4_ | (uint)!bVar6 * auVar43._0_4_;
              bVar6 = (bool)((byte)(uVar33 >> 1) & 1);
              auVar55._4_4_ = (uint)bVar6 * auVar62._4_4_ | (uint)!bVar6 * auVar43._4_4_;
              bVar6 = (bool)((byte)(uVar33 >> 2) & 1);
              auVar55._8_4_ = (uint)bVar6 * auVar62._8_4_ | (uint)!bVar6 * auVar43._8_4_;
              bVar6 = SUB81(uVar33 >> 3,0);
              auVar55._12_4_ = (uint)bVar6 * auVar62._12_4_ | (uint)!bVar6 * auVar43._12_4_;
              auVar42 = vmovdqa32_avx512vl(auVar42);
              bVar6 = (bool)((byte)uVar33 & 1);
              auVar56._0_4_ = (uint)bVar6 * auVar42._0_4_ | (uint)!bVar6 * auVar41._0_4_;
              bVar6 = (bool)((byte)(uVar33 >> 1) & 1);
              auVar56._4_4_ = (uint)bVar6 * auVar42._4_4_ | (uint)!bVar6 * auVar41._4_4_;
              bVar6 = (bool)((byte)(uVar33 >> 2) & 1);
              auVar56._8_4_ = (uint)bVar6 * auVar42._8_4_ | (uint)!bVar6 * auVar41._8_4_;
              bVar6 = SUB81(uVar33 >> 3,0);
              auVar56._12_4_ = (uint)bVar6 * auVar42._12_4_ | (uint)!bVar6 * auVar41._12_4_;
              auVar51._4_4_ = uVar23;
              auVar51._0_4_ = uVar23;
              auVar51._8_4_ = uVar23;
              auVar51._12_4_ = uVar23;
              uVar33 = vpcmpgtd_avx512vl(auVar51,auVar52);
              uVar33 = uVar33 & 0xf;
              auVar41 = vpblendmd_avx512vl(auVar54,auVar53);
              bVar6 = (bool)((byte)uVar33 & 1);
              auVar47._0_4_ = (uint)bVar6 * auVar41._0_4_ | !bVar6 * uVar23;
              bVar6 = (bool)((byte)(uVar33 >> 1) & 1);
              auVar47._4_4_ = (uint)bVar6 * auVar41._4_4_ | !bVar6 * uVar23;
              bVar6 = (bool)((byte)(uVar33 >> 2) & 1);
              auVar47._8_4_ = (uint)bVar6 * auVar41._8_4_ | !bVar6 * uVar23;
              bVar6 = SUB81(uVar33 >> 3,0);
              auVar47._12_4_ = (uint)bVar6 * auVar41._12_4_ | !bVar6 * uVar23;
              auVar41 = vmovdqa32_avx512vl(auVar54);
              bVar6 = (bool)((byte)uVar33 & 1);
              auVar48._0_4_ = (uint)bVar6 * auVar41._0_4_ | (uint)!bVar6 * auVar53._0_4_;
              bVar6 = (bool)((byte)(uVar33 >> 1) & 1);
              auVar48._4_4_ = (uint)bVar6 * auVar41._4_4_ | (uint)!bVar6 * auVar53._4_4_;
              bVar6 = (bool)((byte)(uVar33 >> 2) & 1);
              auVar48._8_4_ = (uint)bVar6 * auVar41._8_4_ | (uint)!bVar6 * auVar53._8_4_;
              bVar6 = SUB81(uVar33 >> 3,0);
              auVar48._12_4_ = (uint)bVar6 * auVar41._12_4_ | (uint)!bVar6 * auVar53._12_4_;
              auVar41 = vpshufd_avx(auVar48,0xaa);
              auVar42 = vpshufd_avx(auVar56,0xaa);
              uVar33 = vpcmpgtd_avx512vl(auVar41,auVar42);
              uVar33 = uVar33 & 0xf;
              auVar42 = vpblendmd_avx512vl(auVar48,auVar56);
              bVar6 = (bool)((byte)uVar33 & 1);
              auVar49._0_4_ = (uint)bVar6 * auVar42._0_4_ | (uint)!bVar6 * auVar41._0_4_;
              bVar6 = (bool)((byte)(uVar33 >> 1) & 1);
              auVar49._4_4_ = (uint)bVar6 * auVar42._4_4_ | (uint)!bVar6 * auVar41._4_4_;
              bVar6 = (bool)((byte)(uVar33 >> 2) & 1);
              auVar49._8_4_ = (uint)bVar6 * auVar42._8_4_ | (uint)!bVar6 * auVar41._8_4_;
              bVar6 = SUB81(uVar33 >> 3,0);
              auVar49._12_4_ = (uint)bVar6 * auVar42._12_4_ | (uint)!bVar6 * auVar41._12_4_;
              auVar43 = vmovdqa32_avx512vl(auVar48);
              bVar6 = (bool)((byte)uVar33 & 1);
              bVar11 = (bool)((byte)(uVar33 >> 1) & 1);
              bVar7 = (bool)((byte)(uVar33 >> 2) & 1);
              bVar10 = SUB81(uVar33 >> 3,0);
              auVar41 = vpshufd_avx(auVar47,0xaa);
              auVar42 = vpshufd_avx(auVar55,0xaa);
              uVar32 = vpcmpgtd_avx512vl(auVar41,auVar42);
              uVar32 = uVar32 & 0xf;
              auVar42 = vpblendmd_avx512vl(auVar47,auVar55);
              bVar8 = (bool)((byte)uVar32 & 1);
              bVar9 = (bool)((byte)(uVar32 >> 1) & 1);
              uVar33 = CONCAT44((uint)bVar9 * auVar42._4_4_ | (uint)!bVar9 * auVar41._4_4_,
                                (uint)bVar8 * auVar42._0_4_ | (uint)!bVar8 * auVar41._0_4_);
              auVar41 = vmovdqa32_avx512vl(auVar47);
              bVar8 = (bool)((byte)uVar32 & 1);
              auVar50._0_4_ = (uint)bVar8 * auVar41._0_4_ | !bVar8 * auVar55._0_4_;
              bVar8 = (bool)((byte)(uVar32 >> 1) & 1);
              auVar50._4_4_ = (uint)bVar8 * auVar41._4_4_ | !bVar8 * auVar55._4_4_;
              bVar8 = (bool)((byte)(uVar32 >> 2) & 1);
              auVar50._8_4_ = (uint)bVar8 * auVar41._8_4_ | !bVar8 * auVar55._8_4_;
              bVar8 = SUB81(uVar32 >> 3,0);
              auVar50._12_4_ = (uint)bVar8 * auVar41._12_4_ | !bVar8 * auVar55._12_4_;
              auVar41 = vpshufd_avx(auVar50,0xaa);
              auVar42 = vpshufd_avx(auVar49,0xaa);
              uVar32 = vpcmpgtd_avx512vl(auVar42,auVar41);
              uVar32 = uVar32 & 0xf;
              auVar42 = vpblendmd_avx512vl(auVar49,auVar50);
              bVar8 = (bool)((byte)uVar32 & 1);
              SVar45.ptr.ptr._0_4_ = (uint)bVar8 * auVar42._0_4_ | (uint)!bVar8 * auVar41._0_4_;
              bVar8 = (bool)((byte)(uVar32 >> 1) & 1);
              SVar45.ptr.ptr._4_4_ = (uint)bVar8 * auVar42._4_4_ | (uint)!bVar8 * auVar41._4_4_;
              bVar8 = (bool)((byte)(uVar32 >> 2) & 1);
              SVar45.dist = (uint)bVar8 * auVar42._8_4_ | (uint)!bVar8 * auVar41._8_4_;
              bVar8 = SUB81(uVar32 >> 3,0);
              SVar45._12_4_ = (uint)bVar8 * auVar42._12_4_ | (uint)!bVar8 * auVar41._12_4_;
              auVar41 = vmovdqa32_avx512vl(auVar49);
              bVar8 = (bool)((byte)uVar32 & 1);
              SVar46.ptr.ptr._0_4_ = (uint)bVar8 * auVar41._0_4_ | !bVar8 * auVar50._0_4_;
              bVar8 = (bool)((byte)(uVar32 >> 1) & 1);
              SVar46.ptr.ptr._4_4_ = (uint)bVar8 * auVar41._4_4_ | !bVar8 * auVar50._4_4_;
              bVar8 = (bool)((byte)(uVar32 >> 2) & 1);
              SVar46.dist = (uint)bVar8 * auVar41._8_4_ | !bVar8 * auVar50._8_4_;
              bVar8 = SUB81(uVar32 >> 3,0);
              SVar46._12_4_ = (uint)bVar8 * auVar41._12_4_ | !bVar8 * auVar50._12_4_;
              *(uint *)&(pSVar21->ptr).ptr = (uint)bVar6 * auVar43._0_4_ | !bVar6 * auVar56._0_4_;
              *(uint *)((long)&(pSVar21->ptr).ptr + 4) =
                   (uint)bVar11 * auVar43._4_4_ | !bVar11 * auVar56._4_4_;
              pSVar21->dist = (uint)bVar7 * auVar43._8_4_ | !bVar7 * auVar56._8_4_;
              *(uint *)&pSVar21->field_0xc =
                   (uint)bVar10 * auVar43._12_4_ | !bVar10 * auVar56._12_4_;
              pSVar21[1] = SVar46;
              pSVar21[2] = SVar45;
              pSVar21 = pSVar21 + 3;
            }
          }
        }
      }
      local_11b8 = (ulong)((uint)uVar33 & 0xf) - 8;
      if (local_11b8 != 0) {
        uVar33 = uVar33 & 0xfffffffffffffff0;
        local_11f8 = 0;
        do {
          lVar29 = local_11f8 * 0x140;
          uVar83 = *(undefined4 *)(ray + k * 4 + 0x70);
          auVar61._4_4_ = uVar83;
          auVar61._0_4_ = uVar83;
          auVar61._8_4_ = uVar83;
          auVar61._12_4_ = uVar83;
          auVar41 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar33 + 0x90 + lVar29),auVar61,
                                    *(undefined1 (*) [16])(uVar33 + lVar29));
          auVar42 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar33 + 0xa0 + lVar29),auVar61,
                                    *(undefined1 (*) [16])(uVar33 + 0x10 + lVar29));
          auVar43 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar33 + 0xb0 + lVar29),auVar61,
                                    *(undefined1 (*) [16])(uVar33 + 0x20 + lVar29));
          auVar62 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar33 + 0xc0 + lVar29),auVar61,
                                    *(undefined1 (*) [16])(uVar33 + 0x30 + lVar29));
          auVar52 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar33 + 0xd0 + lVar29),auVar61,
                                    *(undefined1 (*) [16])(uVar33 + 0x40 + lVar29));
          auVar53 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar33 + 0xe0 + lVar29),auVar61,
                                    *(undefined1 (*) [16])(uVar33 + 0x50 + lVar29));
          auVar54 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar33 + 0xf0 + lVar29),auVar61,
                                    *(undefined1 (*) [16])(uVar33 + 0x60 + lVar29));
          auVar55 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar33 + 0x100 + lVar29),auVar61,
                                    *(undefined1 (*) [16])(uVar33 + 0x70 + lVar29));
          auVar56 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar33 + 0x110 + lVar29),auVar61,
                                    *(undefined1 (*) [16])(uVar33 + 0x80 + lVar29));
          uVar83 = *(undefined4 *)(ray + k * 4);
          auVar66._4_4_ = uVar83;
          auVar66._0_4_ = uVar83;
          auVar66._8_4_ = uVar83;
          auVar66._12_4_ = uVar83;
          auVar47 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x10)));
          auVar48 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x20)));
          uVar83 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar79._4_4_ = uVar83;
          auVar79._0_4_ = uVar83;
          auVar79._8_4_ = uVar83;
          auVar79._12_4_ = uVar83;
          uVar83 = *(undefined4 *)(ray + k * 4 + 0x50);
          auVar81._4_4_ = uVar83;
          auVar81._0_4_ = uVar83;
          auVar81._8_4_ = uVar83;
          auVar81._12_4_ = uVar83;
          fVar88 = *(float *)(ray + k * 4 + 0x60);
          auVar90._4_4_ = fVar88;
          auVar90._0_4_ = fVar88;
          auVar90._8_4_ = fVar88;
          auVar90._12_4_ = fVar88;
          auVar41 = vsubps_avx(auVar41,auVar66);
          auVar49 = vsubps_avx512vl(auVar42,auVar47);
          auVar50 = vsubps_avx512vl(auVar43,auVar48);
          auVar51 = vsubps_avx512vl(auVar62,auVar66);
          auVar52 = vsubps_avx512vl(auVar52,auVar47);
          auVar53 = vsubps_avx512vl(auVar53,auVar48);
          auVar54 = vsubps_avx512vl(auVar54,auVar66);
          auVar55 = vsubps_avx512vl(auVar55,auVar47);
          auVar56 = vsubps_avx512vl(auVar56,auVar48);
          auVar47 = vsubps_avx512vl(auVar54,auVar41);
          auVar48 = vsubps_avx512vl(auVar55,auVar49);
          auVar42 = vsubps_avx(auVar56,auVar50);
          auVar57 = vsubps_avx512vl(auVar41,auVar51);
          auVar58 = vsubps_avx512vl(auVar49,auVar52);
          auVar59 = vsubps_avx512vl(auVar50,auVar53);
          auVar60 = vsubps_avx512vl(auVar51,auVar54);
          auVar61 = vsubps_avx512vl(auVar52,auVar55);
          auVar43 = vsubps_avx(auVar53,auVar56);
          auVar62 = vaddps_avx512vl(auVar54,auVar41);
          auVar63 = vaddps_avx512vl(auVar55,auVar49);
          auVar64 = vaddps_avx512vl(auVar56,auVar50);
          auVar65 = vmulps_avx512vl(auVar63,auVar42);
          auVar65 = vfmsub231ps_avx512vl(auVar65,auVar48,auVar64);
          auVar64 = vmulps_avx512vl(auVar64,auVar47);
          auVar64 = vfmsub231ps_avx512vl(auVar64,auVar42,auVar62);
          auVar76._0_4_ = auVar48._0_4_ * auVar62._0_4_;
          auVar76._4_4_ = auVar48._4_4_ * auVar62._4_4_;
          auVar76._8_4_ = auVar48._8_4_ * auVar62._8_4_;
          auVar76._12_4_ = auVar48._12_4_ * auVar62._12_4_;
          auVar62 = vfmsub231ps_fma(auVar76,auVar47,auVar63);
          auVar77._0_4_ = fVar88 * auVar62._0_4_;
          auVar77._4_4_ = fVar88 * auVar62._4_4_;
          auVar77._8_4_ = fVar88 * auVar62._8_4_;
          auVar77._12_4_ = fVar88 * auVar62._12_4_;
          auVar62 = vfmadd231ps_avx512vl(auVar77,auVar81,auVar64);
          tNear.field_0 =
               (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
               vfmadd231ps_avx512vl(auVar62,auVar79,auVar65);
          auVar62 = vaddps_avx512vl(auVar41,auVar51);
          auVar63 = vaddps_avx512vl(auVar49,auVar52);
          auVar64 = vaddps_avx512vl(auVar50,auVar53);
          auVar65 = vmulps_avx512vl(auVar63,auVar59);
          auVar65 = vfmsub231ps_avx512vl(auVar65,auVar58,auVar64);
          auVar64 = vmulps_avx512vl(auVar64,auVar57);
          auVar64 = vfmsub231ps_avx512vl(auVar64,auVar59,auVar62);
          auVar62 = vmulps_avx512vl(auVar62,auVar58);
          auVar62 = vfmsub231ps_avx512vl(auVar62,auVar57,auVar63);
          auVar78._0_4_ = fVar88 * auVar62._0_4_;
          auVar78._4_4_ = fVar88 * auVar62._4_4_;
          auVar78._8_4_ = fVar88 * auVar62._8_4_;
          auVar78._12_4_ = fVar88 * auVar62._12_4_;
          auVar62 = vfmadd231ps_avx512vl(auVar78,auVar81,auVar64);
          auVar66 = vfmadd231ps_avx512vl(auVar62,auVar79,auVar65);
          auVar54 = vaddps_avx512vl(auVar51,auVar54);
          auVar52 = vaddps_avx512vl(auVar52,auVar55);
          auVar99._0_4_ = auVar53._0_4_ + auVar56._0_4_;
          auVar99._4_4_ = auVar53._4_4_ + auVar56._4_4_;
          auVar99._8_4_ = auVar53._8_4_ + auVar56._8_4_;
          auVar99._12_4_ = auVar53._12_4_ + auVar56._12_4_;
          auVar62 = vmulps_avx512vl(auVar52,auVar43);
          auVar62 = vfmsub231ps_fma(auVar62,auVar61,auVar99);
          auVar100._0_4_ = auVar99._0_4_ * auVar60._0_4_;
          auVar100._4_4_ = auVar99._4_4_ * auVar60._4_4_;
          auVar100._8_4_ = auVar99._8_4_ * auVar60._8_4_;
          auVar100._12_4_ = auVar99._12_4_ * auVar60._12_4_;
          auVar53 = vfmsub231ps_avx512vl(auVar100,auVar43,auVar54);
          auVar54 = vmulps_avx512vl(auVar54,auVar61);
          auVar52 = vfmsub231ps_avx512vl(auVar54,auVar60,auVar52);
          auVar52 = vmulps_avx512vl(auVar52,auVar90);
          auVar52 = vfmadd231ps_avx512vl(auVar52,auVar81,auVar53);
          auVar62 = vfmadd231ps_avx512vl(auVar52,auVar79,auVar62);
          auVar101._0_4_ = tNear.field_0._0_4_ + auVar66._0_4_;
          auVar101._4_4_ = tNear.field_0._4_4_ + auVar66._4_4_;
          auVar101._8_4_ = tNear.field_0._8_4_ + auVar66._8_4_;
          auVar101._12_4_ = tNear.field_0._12_4_ + auVar66._12_4_;
          auVar52 = vaddps_avx512vl(auVar62,auVar101);
          auVar63._8_4_ = 0x7fffffff;
          auVar63._0_8_ = 0x7fffffff7fffffff;
          auVar63._12_4_ = 0x7fffffff;
          auVar53 = vandps_avx512vl(auVar52,auVar63);
          auVar64._8_4_ = 0x34000000;
          auVar64._0_8_ = 0x3400000034000000;
          auVar64._12_4_ = 0x34000000;
          auVar54 = vmulps_avx512vl(auVar53,auVar64);
          auVar55 = vminps_avx512vl((undefined1  [16])tNear.field_0,auVar66);
          auVar55 = vminps_avx512vl(auVar55,auVar62);
          auVar65._8_4_ = 0x80000000;
          auVar65._0_8_ = 0x8000000080000000;
          auVar65._12_4_ = 0x80000000;
          auVar56 = vxorps_avx512vl(auVar54,auVar65);
          uVar12 = vcmpps_avx512vl(auVar55,auVar56,5);
          auVar55 = vmaxps_avx512vl((undefined1  [16])tNear.field_0,auVar66);
          auVar62 = vmaxps_avx512vl(auVar55,auVar62);
          uVar14 = vcmpps_avx512vl(auVar62,auVar54,2);
          bVar22 = ((byte)uVar12 | (byte)uVar14) & 0xf;
          if (bVar22 != 0) {
            auVar62 = vmulps_avx512vl(auVar58,auVar42);
            auVar54 = vmulps_avx512vl(auVar47,auVar59);
            auVar55 = vmulps_avx512vl(auVar57,auVar48);
            auVar56 = vmulps_avx512vl(auVar61,auVar59);
            auVar51 = vmulps_avx512vl(auVar57,auVar43);
            auVar63 = vmulps_avx512vl(auVar60,auVar58);
            auVar48 = vfmsub213ps_avx512vl(auVar48,auVar59,auVar62);
            auVar42 = vfmsub213ps_avx512vl(auVar42,auVar57,auVar54);
            auVar47 = vfmsub213ps_avx512vl(auVar47,auVar58,auVar55);
            auVar43 = vfmsub213ps_avx512vl(auVar43,auVar58,auVar56);
            auVar58 = vfmsub213ps_avx512vl(auVar60,auVar59,auVar51);
            auVar57 = vfmsub213ps_avx512vl(auVar61,auVar57,auVar63);
            auVar59 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar62 = vandps_avx512vl(auVar62,auVar59);
            auVar56 = vandps_avx512vl(auVar56,auVar59);
            uVar32 = vcmpps_avx512vl(auVar62,auVar56,1);
            auVar62 = vandps_avx512vl(auVar54,auVar59);
            auVar54 = vandps_avx512vl(auVar51,auVar59);
            uVar26 = vcmpps_avx512vl(auVar62,auVar54,1);
            auVar62 = vandps_avx512vl(auVar55,auVar59);
            auVar54 = vandps_avx512vl(auVar63,auVar59);
            uVar28 = vcmpps_avx512vl(auVar62,auVar54,1);
            bVar6 = (bool)((byte)uVar32 & 1);
            local_1088._0_4_ = (uint)bVar6 * auVar48._0_4_ | (uint)!bVar6 * auVar43._0_4_;
            bVar6 = (bool)((byte)(uVar32 >> 1) & 1);
            local_1088._4_4_ = (uint)bVar6 * auVar48._4_4_ | (uint)!bVar6 * auVar43._4_4_;
            bVar6 = (bool)((byte)(uVar32 >> 2) & 1);
            local_1088._8_4_ = (uint)bVar6 * auVar48._8_4_ | (uint)!bVar6 * auVar43._8_4_;
            bVar6 = (bool)((byte)(uVar32 >> 3) & 1);
            local_1088._12_4_ = (uint)bVar6 * auVar48._12_4_ | (uint)!bVar6 * auVar43._12_4_;
            bVar6 = (bool)((byte)uVar26 & 1);
            local_1078._0_4_ = (uint)bVar6 * auVar42._0_4_ | (uint)!bVar6 * auVar58._0_4_;
            bVar6 = (bool)((byte)(uVar26 >> 1) & 1);
            local_1078._4_4_ = (uint)bVar6 * auVar42._4_4_ | (uint)!bVar6 * auVar58._4_4_;
            bVar6 = (bool)((byte)(uVar26 >> 2) & 1);
            local_1078._8_4_ = (uint)bVar6 * auVar42._8_4_ | (uint)!bVar6 * auVar58._8_4_;
            bVar6 = (bool)((byte)(uVar26 >> 3) & 1);
            local_1078._12_4_ = (uint)bVar6 * auVar42._12_4_ | (uint)!bVar6 * auVar58._12_4_;
            bVar6 = (bool)((byte)uVar28 & 1);
            local_1068[0] = (float)((uint)bVar6 * auVar47._0_4_ | (uint)!bVar6 * auVar57._0_4_);
            bVar6 = (bool)((byte)(uVar28 >> 1) & 1);
            local_1068[1] = (float)((uint)bVar6 * auVar47._4_4_ | (uint)!bVar6 * auVar57._4_4_);
            bVar6 = (bool)((byte)(uVar28 >> 2) & 1);
            local_1068[2] = (float)((uint)bVar6 * auVar47._8_4_ | (uint)!bVar6 * auVar57._8_4_);
            bVar6 = (bool)((byte)(uVar28 >> 3) & 1);
            local_1068[3] = (float)((uint)bVar6 * auVar47._12_4_ | (uint)!bVar6 * auVar57._12_4_);
            auVar91._0_4_ = fVar88 * local_1068[0];
            auVar91._4_4_ = fVar88 * local_1068[1];
            auVar91._8_4_ = fVar88 * local_1068[2];
            auVar91._12_4_ = fVar88 * local_1068[3];
            auVar42 = vfmadd213ps_fma(auVar81,local_1078,auVar91);
            auVar42 = vfmadd213ps_fma(auVar79,local_1088,auVar42);
            auVar80._0_4_ = auVar42._0_4_ + auVar42._0_4_;
            auVar80._4_4_ = auVar42._4_4_ + auVar42._4_4_;
            auVar80._8_4_ = auVar42._8_4_ + auVar42._8_4_;
            auVar80._12_4_ = auVar42._12_4_ + auVar42._12_4_;
            auVar82._0_4_ = auVar50._0_4_ * local_1068[0];
            auVar82._4_4_ = auVar50._4_4_ * local_1068[1];
            auVar82._8_4_ = auVar50._8_4_ * local_1068[2];
            auVar82._12_4_ = auVar50._12_4_ * local_1068[3];
            auVar42 = vfmadd213ps_fma(auVar49,local_1078,auVar82);
            auVar42 = vfmadd213ps_fma(auVar41,local_1088,auVar42);
            auVar41 = vrcp14ps_avx512vl(auVar80);
            auVar15._8_4_ = 0x3f800000;
            auVar15._0_8_ = 0x3f8000003f800000;
            auVar15._12_4_ = 0x3f800000;
            auVar43 = vfnmadd213ps_avx512vl(auVar41,auVar80,auVar15);
            auVar41 = vfmadd132ps_fma(auVar43,auVar41,auVar41);
            uVar83 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar85._4_4_ = uVar83;
            auVar85._0_4_ = uVar83;
            auVar85._8_4_ = uVar83;
            auVar85._12_4_ = uVar83;
            auVar102 = ZEXT1664(auVar85);
            local_1098._0_4_ = auVar41._0_4_ * (auVar42._0_4_ + auVar42._0_4_);
            local_1098._4_4_ = auVar41._4_4_ * (auVar42._4_4_ + auVar42._4_4_);
            local_1098._8_4_ = auVar41._8_4_ * (auVar42._8_4_ + auVar42._8_4_);
            local_1098._12_4_ = auVar41._12_4_ * (auVar42._12_4_ + auVar42._12_4_);
            auVar74 = ZEXT1664(local_1098);
            uVar12 = vcmpps_avx512vl(local_1098,auVar85,2);
            uVar83 = *(undefined4 *)(ray + k * 4 + 0x30);
            auVar16._4_4_ = uVar83;
            auVar16._0_4_ = uVar83;
            auVar16._8_4_ = uVar83;
            auVar16._12_4_ = uVar83;
            uVar14 = vcmpps_avx512vl(local_1098,auVar16,0xd);
            bVar22 = (byte)uVar12 & (byte)uVar14 & bVar22;
            if (bVar22 != 0) {
              uVar12 = vcmpps_avx512vl(auVar80,_DAT_01f7aa10,4);
              bVar22 = bVar22 & (byte)uVar12;
              uVar23 = (uint)bVar22;
              if (bVar22 != 0) {
                pSVar3 = context->scene;
                auVar17._8_4_ = 0x219392ef;
                auVar17._0_8_ = 0x219392ef219392ef;
                auVar17._12_4_ = 0x219392ef;
                uVar32 = vcmpps_avx512vl(auVar53,auVar17,5);
                auVar42 = vrcp14ps_avx512vl(auVar52);
                auVar75._8_4_ = 0x3f800000;
                auVar75._0_8_ = 0x3f8000003f800000;
                auVar75._12_4_ = 0x3f800000;
                auVar41 = vfnmadd213ps_fma(auVar52,auVar42,auVar75);
                auVar41 = vfmadd132ps_avx512vl(auVar41,auVar42,auVar42);
                fVar84 = (float)((uint)((byte)uVar32 & 1) * auVar41._0_4_);
                fVar98 = (float)((uint)((byte)(uVar32 >> 1) & 1) * auVar41._4_4_);
                fVar94 = (float)((uint)((byte)(uVar32 >> 2) & 1) * auVar41._8_4_);
                fVar88 = (float)((uint)((byte)(uVar32 >> 3) & 1) * auVar41._12_4_);
                auVar69._0_4_ = fVar84 * tNear.field_0._0_4_;
                auVar69._4_4_ = fVar98 * tNear.field_0._4_4_;
                auVar69._8_4_ = fVar94 * tNear.field_0._8_4_;
                auVar69._12_4_ = fVar88 * tNear.field_0._12_4_;
                local_10b8 = vminps_avx(auVar69,auVar75);
                auVar70._0_4_ = fVar84 * auVar66._0_4_;
                auVar70._4_4_ = fVar98 * auVar66._4_4_;
                auVar70._8_4_ = fVar94 * auVar66._8_4_;
                auVar70._12_4_ = fVar88 * auVar66._12_4_;
                local_10a8 = vminps_avx(auVar70,auVar75);
                lVar29 = lVar29 + uVar33;
                auVar71._8_4_ = 0x7f800000;
                auVar71._0_8_ = 0x7f8000007f800000;
                auVar71._12_4_ = 0x7f800000;
                auVar41 = vblendmps_avx512vl(auVar71,local_1098);
                auVar67._0_4_ =
                     (uint)(bVar22 & 1) * auVar41._0_4_ | (uint)!(bool)(bVar22 & 1) * 0x7f800000;
                bVar6 = (bool)(bVar22 >> 1 & 1);
                auVar67._4_4_ = (uint)bVar6 * auVar41._4_4_ | (uint)!bVar6 * 0x7f800000;
                bVar6 = (bool)(bVar22 >> 2 & 1);
                auVar67._8_4_ = (uint)bVar6 * auVar41._8_4_ | (uint)!bVar6 * 0x7f800000;
                auVar67._12_4_ =
                     (uint)(bVar22 >> 3) * auVar41._12_4_ | (uint)!(bool)(bVar22 >> 3) * 0x7f800000;
                auVar41 = vshufps_avx(auVar67,auVar67,0xb1);
                auVar41 = vminps_avx(auVar41,auVar67);
                auVar42 = vshufpd_avx(auVar41,auVar41,1);
                auVar41 = vminps_avx(auVar42,auVar41);
                uVar12 = vcmpps_avx512vl(auVar67,auVar41,0);
                if (((byte)uVar12 & bVar22) != 0) {
                  bVar22 = (byte)uVar12 & bVar22;
                }
                uVar25 = 0;
                for (uVar24 = (uint)bVar22; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x80000000) {
                  uVar25 = uVar25 + 1;
                }
                do {
                  uVar31 = uVar25 & 0xff;
                  uVar24 = *(uint *)(lVar29 + 0x120 + (ulong)uVar31 * 4);
                  pGVar4 = (pSVar3->geometries).items[uVar24].ptr;
                  if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                    bVar22 = ~(byte)(1 << (uVar25 & 0x1f)) & (byte)uVar23;
                  }
                  else {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      uVar32 = (ulong)(uVar31 << 2);
                      uVar83 = *(undefined4 *)(local_10b8 + uVar32);
                      uVar2 = *(undefined4 *)(local_10a8 + uVar32);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1098 + uVar32);
                      *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_1088 + uVar32);
                      *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_1078 + uVar32);
                      *(undefined4 *)(ray + k * 4 + 0xe0) =
                           *(undefined4 *)((long)local_1068 + uVar32);
                      *(undefined4 *)(ray + k * 4 + 0xf0) = uVar83;
                      *(undefined4 *)(ray + k * 4 + 0x100) = uVar2;
                      *(undefined4 *)(ray + k * 4 + 0x110) =
                           *(undefined4 *)(lVar29 + 0x130 + uVar32);
                      *(uint *)(ray + k * 4 + 0x120) = uVar24;
                      *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      break;
                    }
                    uVar32 = (ulong)(uVar31 * 4);
                    uVar83 = *(undefined4 *)(local_10b8 + uVar32);
                    local_fd8._4_4_ = uVar83;
                    local_fd8._0_4_ = uVar83;
                    local_fd8._8_4_ = uVar83;
                    local_fd8._12_4_ = uVar83;
                    local_fc8 = *(undefined4 *)(local_10a8 + uVar32);
                    local_fa8 = vpbroadcastd_avx512vl();
                    uVar83 = *(undefined4 *)(lVar29 + 0x130 + uVar32);
                    local_fb8._4_4_ = uVar83;
                    local_fb8._0_4_ = uVar83;
                    local_fb8._8_4_ = uVar83;
                    local_fb8._12_4_ = uVar83;
                    uVar83 = *(undefined4 *)(local_1088 + uVar32);
                    uVar2 = *(undefined4 *)(local_1078 + uVar32);
                    local_ff8._4_4_ = uVar2;
                    local_ff8._0_4_ = uVar2;
                    local_ff8._8_4_ = uVar2;
                    local_ff8._12_4_ = uVar2;
                    uVar2 = *(undefined4 *)((long)local_1068 + uVar32);
                    local_fe8._4_4_ = uVar2;
                    local_fe8._0_4_ = uVar2;
                    local_fe8._8_4_ = uVar2;
                    local_fe8._12_4_ = uVar2;
                    local_1008[0] = (RTCHitN)(char)uVar83;
                    local_1008[1] = (RTCHitN)(char)((uint)uVar83 >> 8);
                    local_1008[2] = (RTCHitN)(char)((uint)uVar83 >> 0x10);
                    local_1008[3] = (RTCHitN)(char)((uint)uVar83 >> 0x18);
                    local_1008[4] = (RTCHitN)(char)uVar83;
                    local_1008[5] = (RTCHitN)(char)((uint)uVar83 >> 8);
                    local_1008[6] = (RTCHitN)(char)((uint)uVar83 >> 0x10);
                    local_1008[7] = (RTCHitN)(char)((uint)uVar83 >> 0x18);
                    local_1008[8] = (RTCHitN)(char)uVar83;
                    local_1008[9] = (RTCHitN)(char)((uint)uVar83 >> 8);
                    local_1008[10] = (RTCHitN)(char)((uint)uVar83 >> 0x10);
                    local_1008[0xb] = (RTCHitN)(char)((uint)uVar83 >> 0x18);
                    local_1008[0xc] = (RTCHitN)(char)uVar83;
                    local_1008[0xd] = (RTCHitN)(char)((uint)uVar83 >> 8);
                    local_1008[0xe] = (RTCHitN)(char)((uint)uVar83 >> 0x10);
                    local_1008[0xf] = (RTCHitN)(char)((uint)uVar83 >> 0x18);
                    uStack_fc4 = local_fc8;
                    uStack_fc0 = local_fc8;
                    uStack_fbc = local_fc8;
                    vpcmpeqd_avx2(ZEXT1632(local_fd8),ZEXT1632(local_fd8));
                    uStack_f94 = context->user->instID[0];
                    local_f98 = uStack_f94;
                    uStack_f90 = uStack_f94;
                    uStack_f8c = uStack_f94;
                    uStack_f88 = context->user->instPrimID[0];
                    uStack_f84 = uStack_f88;
                    uStack_f80 = uStack_f88;
                    uStack_f7c = uStack_f88;
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1098 + uVar32);
                    local_11c8 = local_1058;
                    args.valid = (int *)local_11c8;
                    args.geometryUserPtr = pGVar4->userPtr;
                    args.context = context->user;
                    args.hit = local_1008;
                    args.N = 4;
                    auVar41 = auVar74._0_16_;
                    auVar42 = auVar102._0_16_;
                    args.ray = (RTCRayN *)ray;
                    if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar4->intersectionFilterN)(&args);
                      auVar102 = ZEXT1664(auVar42);
                      auVar74 = ZEXT1664(auVar41);
                    }
                    uVar32 = vptestmd_avx512vl(local_11c8,local_11c8);
                    if ((uVar32 & 0xf) == 0) {
LAB_006ca9a7:
                      *(int *)(ray + k * 4 + 0x80) = auVar102._0_4_;
                    }
                    else {
                      p_Var5 = context->args->filter;
                      if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var5)(&args);
                        auVar102 = ZEXT1664(auVar42);
                        auVar74 = ZEXT1664(auVar41);
                      }
                      uVar32 = vptestmd_avx512vl(local_11c8,local_11c8);
                      uVar32 = uVar32 & 0xf;
                      bVar22 = (byte)uVar32;
                      if (bVar22 == 0) goto LAB_006ca9a7;
                      iVar1 = *(int *)(args.hit + 4);
                      iVar18 = *(int *)(args.hit + 8);
                      iVar19 = *(int *)(args.hit + 0xc);
                      bVar6 = (bool)((byte)(uVar32 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar32 >> 2) & 1);
                      bVar11 = SUB81(uVar32 >> 3,0);
                      *(uint *)(args.ray + 0xc0) =
                           (uint)(bVar22 & 1) * *(int *)args.hit |
                           (uint)!(bool)(bVar22 & 1) * *(uint *)(args.ray + 0xc0);
                      *(uint *)(args.ray + 0xc4) =
                           (uint)bVar6 * iVar1 | (uint)!bVar6 * *(int *)(args.ray + 0xc4);
                      *(uint *)(args.ray + 200) =
                           (uint)bVar8 * iVar18 | (uint)!bVar8 * *(int *)(args.ray + 200);
                      *(uint *)(args.ray + 0xcc) =
                           (uint)bVar11 * iVar19 | (uint)!bVar11 * *(int *)(args.ray + 0xcc);
                      iVar1 = *(int *)(args.hit + 0x14);
                      iVar18 = *(int *)(args.hit + 0x18);
                      iVar19 = *(int *)(args.hit + 0x1c);
                      bVar6 = (bool)((byte)(uVar32 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar32 >> 2) & 1);
                      bVar11 = SUB81(uVar32 >> 3,0);
                      *(uint *)(args.ray + 0xd0) =
                           (uint)(bVar22 & 1) * *(int *)(args.hit + 0x10) |
                           (uint)!(bool)(bVar22 & 1) * *(uint *)(args.ray + 0xd0);
                      *(uint *)(args.ray + 0xd4) =
                           (uint)bVar6 * iVar1 | (uint)!bVar6 * *(int *)(args.ray + 0xd4);
                      *(uint *)(args.ray + 0xd8) =
                           (uint)bVar8 * iVar18 | (uint)!bVar8 * *(int *)(args.ray + 0xd8);
                      *(uint *)(args.ray + 0xdc) =
                           (uint)bVar11 * iVar19 | (uint)!bVar11 * *(int *)(args.ray + 0xdc);
                      iVar1 = *(int *)(args.hit + 0x24);
                      iVar18 = *(int *)(args.hit + 0x28);
                      iVar19 = *(int *)(args.hit + 0x2c);
                      bVar6 = (bool)((byte)(uVar32 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar32 >> 2) & 1);
                      bVar11 = SUB81(uVar32 >> 3,0);
                      *(uint *)(args.ray + 0xe0) =
                           (uint)(bVar22 & 1) * *(int *)(args.hit + 0x20) |
                           (uint)!(bool)(bVar22 & 1) * *(uint *)(args.ray + 0xe0);
                      *(uint *)(args.ray + 0xe4) =
                           (uint)bVar6 * iVar1 | (uint)!bVar6 * *(int *)(args.ray + 0xe4);
                      *(uint *)(args.ray + 0xe8) =
                           (uint)bVar8 * iVar18 | (uint)!bVar8 * *(int *)(args.ray + 0xe8);
                      *(uint *)(args.ray + 0xec) =
                           (uint)bVar11 * iVar19 | (uint)!bVar11 * *(int *)(args.ray + 0xec);
                      iVar1 = *(int *)(args.hit + 0x34);
                      iVar18 = *(int *)(args.hit + 0x38);
                      iVar19 = *(int *)(args.hit + 0x3c);
                      bVar6 = (bool)((byte)(uVar32 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar32 >> 2) & 1);
                      bVar11 = SUB81(uVar32 >> 3,0);
                      *(uint *)(args.ray + 0xf0) =
                           (uint)(bVar22 & 1) * *(int *)(args.hit + 0x30) |
                           (uint)!(bool)(bVar22 & 1) * *(uint *)(args.ray + 0xf0);
                      *(uint *)(args.ray + 0xf4) =
                           (uint)bVar6 * iVar1 | (uint)!bVar6 * *(int *)(args.ray + 0xf4);
                      *(uint *)(args.ray + 0xf8) =
                           (uint)bVar8 * iVar18 | (uint)!bVar8 * *(int *)(args.ray + 0xf8);
                      *(uint *)(args.ray + 0xfc) =
                           (uint)bVar11 * iVar19 | (uint)!bVar11 * *(int *)(args.ray + 0xfc);
                      iVar1 = *(int *)(args.hit + 0x44);
                      iVar18 = *(int *)(args.hit + 0x48);
                      iVar19 = *(int *)(args.hit + 0x4c);
                      bVar6 = (bool)((byte)(uVar32 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar32 >> 2) & 1);
                      bVar11 = SUB81(uVar32 >> 3,0);
                      *(uint *)(args.ray + 0x100) =
                           (uint)(bVar22 & 1) * *(int *)(args.hit + 0x40) |
                           (uint)!(bool)(bVar22 & 1) * *(uint *)(args.ray + 0x100);
                      *(uint *)(args.ray + 0x104) =
                           (uint)bVar6 * iVar1 | (uint)!bVar6 * *(int *)(args.ray + 0x104);
                      *(uint *)(args.ray + 0x108) =
                           (uint)bVar8 * iVar18 | (uint)!bVar8 * *(int *)(args.ray + 0x108);
                      *(uint *)(args.ray + 0x10c) =
                           (uint)bVar11 * iVar19 | (uint)!bVar11 * *(int *)(args.ray + 0x10c);
                      auVar41 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x50));
                      *(undefined1 (*) [16])(args.ray + 0x110) = auVar41;
                      auVar41 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x60));
                      *(undefined1 (*) [16])(args.ray + 0x120) = auVar41;
                      auVar41 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x70));
                      *(undefined1 (*) [16])(args.ray + 0x130) = auVar41;
                      auVar41 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x80));
                      *(undefined1 (*) [16])(args.ray + 0x140) = auVar41;
                      auVar102 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
                    }
                    uVar83 = auVar102._0_4_;
                    auVar73._4_4_ = uVar83;
                    auVar73._0_4_ = uVar83;
                    auVar73._8_4_ = uVar83;
                    auVar73._12_4_ = uVar83;
                    uVar12 = vcmpps_avx512vl(auVar74._0_16_,auVar73,2);
                    bVar22 = ~(byte)(1 << (uVar25 & 0x1f)) & (byte)uVar23 & (byte)uVar12;
                  }
                  uVar23 = (uint)bVar22;
                  if (bVar22 == 0) break;
                  auVar72._8_4_ = 0x7f800000;
                  auVar72._0_8_ = 0x7f8000007f800000;
                  auVar72._12_4_ = 0x7f800000;
                  auVar41 = vblendmps_avx512vl(auVar72,auVar74._0_16_);
                  auVar68._0_4_ =
                       (uint)(bVar22 & 1) * auVar41._0_4_ | (uint)!(bool)(bVar22 & 1) * 0x7f800000;
                  bVar6 = (bool)(bVar22 >> 1 & 1);
                  auVar68._4_4_ = (uint)bVar6 * auVar41._4_4_ | (uint)!bVar6 * 0x7f800000;
                  bVar6 = (bool)(bVar22 >> 2 & 1);
                  auVar68._8_4_ = (uint)bVar6 * auVar41._8_4_ | (uint)!bVar6 * 0x7f800000;
                  auVar68._12_4_ =
                       (uint)(bVar22 >> 3) * auVar41._12_4_ |
                       (uint)!(bool)(bVar22 >> 3) * 0x7f800000;
                  auVar41 = vshufps_avx(auVar68,auVar68,0xb1);
                  auVar41 = vminps_avx(auVar41,auVar68);
                  auVar42 = vshufpd_avx(auVar41,auVar41,1);
                  auVar41 = vminps_avx(auVar42,auVar41);
                  uVar12 = vcmpps_avx512vl(auVar68,auVar41,0);
                  bVar22 = (byte)uVar12 & bVar22;
                  uVar24 = uVar23;
                  if (bVar22 != 0) {
                    uVar24 = (uint)bVar22;
                  }
                  uVar25 = 0;
                  for (; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x80000000) {
                    uVar25 = uVar25 + 1;
                  }
                } while( true );
              }
            }
          }
          local_11f8 = local_11f8 + 1;
        } while (local_11f8 != local_11b8);
      }
      uVar83 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar74 = ZEXT1664(CONCAT412(uVar83,CONCAT48(uVar83,CONCAT44(uVar83,uVar83))));
      auVar102 = ZEXT1664(local_1048);
      fVar84 = local_1018;
      fVar86 = fStack_1014;
      fVar87 = fStack_1010;
      fVar88 = fStack_100c;
      fVar89 = local_1028;
      fVar92 = fStack_1024;
      fVar93 = fStack_1020;
      fVar94 = fStack_101c;
      fVar95 = local_1038;
      fVar96 = fStack_1034;
      fVar97 = fStack_1030;
      fVar98 = fStack_102c;
    }
    if (pSVar21 == stack) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }